

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void __thiscall Fl_Type::~Fl_Type(Fl_Type *this)

{
  Fl_Type *this_local;
  
  this->_vptr_Fl_Type = (_func_int **)&PTR_setlabel_002e7100;
  if (widget_browser != (Widget_Browser *)0x0) {
    Fl_Browser_::deleting(&widget_browser->super_Fl_Browser_,this);
  }
  if (this->prev == (Fl_Type *)0x0) {
    first = this->next;
  }
  else {
    this->prev->next = this->next;
  }
  if (this->next == (Fl_Type *)0x0) {
    last = this->prev;
  }
  else {
    this->next->prev = this->prev;
  }
  if (current == this) {
    current = (Fl_Type *)0x0;
  }
  if (this->parent != (Fl_Type *)0x0) {
    (*this->parent->_vptr_Fl_Type[10])();
  }
  if (this->name_ != (char *)0x0) {
    free(this->name_);
  }
  if (this->label_ != (char *)0x0) {
    free(this->label_);
  }
  if (this->callback_ != (char *)0x0) {
    free(this->callback_);
  }
  if (this->user_data_ != (char *)0x0) {
    free(this->user_data_);
  }
  if (this->user_data_type_ != (char *)0x0) {
    free(this->user_data_type_);
  }
  if (this->comment_ != (char *)0x0) {
    free(this->comment_);
  }
  return;
}

Assistant:

Fl_Type::~Fl_Type() {
  // warning: destructor only works for widgets that have been add()ed.
  if (widget_browser) widget_browser->deleting(this);
  if (prev) prev->next = next; else first = next;
  if (next) next->prev = prev; else last = prev;
  if (current == this) current = 0;
  if (parent) parent->remove_child(this);
  if (name_) free((void*)name_);
  if (label_) free((void*)label_);
  if (callback_) free((void*)callback_);
  if (user_data_) free((void*)user_data_);
  if (user_data_type_) free((void*)user_data_type_);
  if (comment_) free((void*)comment_);
}